

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2configuration.cpp
# Opt level: O0

bool __thiscall QHttp2Configuration::setMaxFrameSize(QHttp2Configuration *this,uint size)

{
  long lVar1;
  bool bVar2;
  QHttp2ConfigurationPrivate *pQVar3;
  uint in_ESI;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QDebug local_20;
  char *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI < 0x4000) || (0xffffff < in_ESI)) {
    t = (char *)0xaaaaaaaaaaaaaaaa;
    this_00 = in_RDI;
    QtPrivateLogging::QT_HTTP2();
    anon_unknown.dwarf_5f40f1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    while( true ) {
      bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffe8);
      if (!bVar2) break;
      anon_unknown.dwarf_5f40f1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x2b1175);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (char *)0x2b118b);
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),t);
      QDebug::~QDebug(&local_20);
    }
    bVar2 = false;
  }
  else {
    pQVar3 = QSharedDataPointer<QHttp2ConfigurationPrivate>::operator->
                       ((QSharedDataPointer<QHttp2ConfigurationPrivate> *)in_RDI);
    pQVar3->maxFrameSize = in_ESI;
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Configuration::setMaxFrameSize(unsigned size)
{
    if (size < Http2::minPayloadLimit || size > Http2::maxPayloadSize) {
        qCWarning(QT_HTTP2) << "Maximum frame size to advertise is invalid";
        return false;
    }

    d->maxFrameSize = size;
    return true;
}